

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

HasbitMode google::protobuf::internal::cpp::GetFieldHasbitMode(FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  bool bVar2;
  byte bVar3;
  cpp acStack_18 [16];
  
  if ((field->field_0x3 & 1) != 0) {
    if ((field->field_0x1 & 0x10) == 0) goto LAB_0022a13c;
    pOVar1 = (field->scope_).containing_oneof;
    if (pOVar1 == (OneofDescriptor *)0x0) {
      protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    if (pOVar1->field_count_ != 1) {
      return kNoHasbit;
    }
    if ((pOVar1->fields_->field_0x1 & 2) == 0) {
      return kNoHasbit;
    }
    GetFieldHasbitMode(acStack_18);
  }
  if (((field->options_->field_0)._impl_.weak_ != false) || ((field->field_0x1 & 8) != 0)) {
    return kNoHasbit;
  }
  bVar2 = FieldDescriptor::has_presence(field);
  if (bVar2) {
    return kTrueHasbit;
  }
  bVar3 = field->field_0x1 & 0x20;
  if (0xbf < (byte)field->field_0x1 == (bool)(bVar3 >> 5)) {
    return bVar3 >> 4 ^ kHintHasbit;
  }
  GetFieldHasbitMode();
LAB_0022a13c:
  protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb63);
}

Assistant:

HasbitMode GetFieldHasbitMode(const FieldDescriptor* field) {
  // Do not generate hasbits for "real-oneof", weak, or extension fields.
  if (field->real_containing_oneof() || field->options().weak() ||
      field->is_extension()) {
    return HasbitMode::kNoHasbit;
  }

  // Explicit-presence fields always have true hasbits.
  if (field->has_presence()) {
    return HasbitMode::kTrueHasbit;
  }

  // Implicit presence fields.
  if (!field->is_repeated()) {
    return HasbitMode::kHintHasbit;
  }
  // We currently don't implement hasbits for implicit repeated fields.
  return HasbitMode::kNoHasbit;
}